

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_15.cpp
# Opt level: O1

int main(void)

{
  vector<double,_std::allocator<double>_> numbers;
  string out;
  string in;
  vector<double,_std::allocator<double>_> local_70;
  FileType local_54;
  string local_50;
  string local_30;
  
  local_50._M_dataplus._M_p._0_4_ = 0;
  prompt_filename_abi_cxx11_(&local_30,(FileType *)&local_50);
  read_numbers(&local_70,&local_30);
  local_54 = out;
  prompt_filename_abi_cxx11_(&local_50,&local_54);
  write_numbers(&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto in = prompt_filename(FileType::in);
		auto numbers = read_numbers(in);
		auto out = prompt_filename(FileType::out);
		write_numbers(numbers, out);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << '\n';
		return -1;
	}
	catch (...)
	{
		std::cerr << "Unknown exception occured.\n";
		return -2;
	}
}